

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O0

void __thiscall
amrex::AmrMesh::MakeNewGrids
          (AmrMesh *this,int lbase,Real time,int *new_finest,
          Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *new_grids)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  uint *puVar7;
  Long LVar8;
  int *piVar9;
  Geometry *pGVar10;
  Box *pBVar11;
  BoxList *this_00;
  IntVect *pIVar12;
  size_type sVar13;
  int iVar14;
  BATType *in_RDX;
  BATType in_ESI;
  AmrMesh *in_RDI;
  bool bVar15;
  undefined8 in_XMM0_Qa;
  Array<int,_3> AVar16;
  int lev;
  ClusterList clist;
  BoxList new_bx;
  PinnedVector<IntVect> tagvec;
  int n_2;
  int bl_max;
  TagBoxArray tags;
  int ngrow;
  BoxArray levcBA;
  BoxArray ba_proj;
  IntVect ngt;
  int levf;
  int levc;
  int i_3;
  BoxList bl;
  BoxList p_n_comp;
  BoxList p_n;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> p_n_comp_ba;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> p_n_ba;
  Box result;
  int i_2;
  int n_1;
  int i_1;
  int n;
  int i;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> pc_domain;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> rr_lev;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> bf_lev;
  int max_crse;
  int dir;
  IntVect off;
  BoxArray *in_stack_fffffffffffff418;
  AmrMesh *in_stack_fffffffffffff420;
  int in_stack_fffffffffffff42c;
  BoxArray *in_stack_fffffffffffff430;
  undefined4 in_stack_fffffffffffff438;
  BATType in_stack_fffffffffffff43c;
  Geometry *in_stack_fffffffffffff440;
  undefined4 in_stack_fffffffffffff450;
  IntVect *in_stack_fffffffffffff458;
  undefined4 in_stack_fffffffffffff460;
  uint in_stack_fffffffffffff464;
  BoxArray *in_stack_fffffffffffff468;
  AmrMesh *in_stack_fffffffffffff470;
  undefined4 in_stack_fffffffffffff478;
  BoxArray *in_stack_fffffffffffff480;
  IntVect *in_stack_fffffffffffff488;
  BoxArray *in_stack_fffffffffffff490;
  BoxArray *in_stack_fffffffffffff498;
  uint in_stack_fffffffffffff4a0;
  uint in_stack_fffffffffffff4a4;
  undefined4 in_stack_fffffffffffff4b0;
  IndexType in_stack_fffffffffffff4b4;
  IndexType in_stack_fffffffffffff4b8;
  BATType in_stack_fffffffffffff4bc;
  BoxArray *in_stack_fffffffffffff4c0;
  undefined4 in_stack_fffffffffffff4c8;
  undefined4 in_stack_fffffffffffff4cc;
  BoxList *in_stack_fffffffffffff4d0;
  IntVect *in_stack_fffffffffffff500;
  BoxList *in_stack_fffffffffffff508;
  BoxArray *in_stack_fffffffffffff528;
  int local_aa4;
  int local_aa0;
  int local_a9c;
  int local_a94;
  int local_a90;
  int local_a8c;
  int local_a84;
  int local_a80;
  int local_a7c;
  int local_a6c;
  int local_a68;
  int local_a64;
  int local_a5c;
  int local_a58;
  int local_a54;
  int local_a4c;
  int in_stack_fffffffffffff5b8;
  int in_stack_fffffffffffff5bc;
  IntVect *in_stack_fffffffffffff5c0;
  int in_stack_fffffffffffff5c8;
  int in_stack_fffffffffffff5cc;
  int local_a30;
  int local_a2c;
  TagVal local_a24;
  TagVal local_a20;
  TagVal in_stack_fffffffffffff5e4;
  int in_stack_fffffffffffff5e8;
  int in_stack_fffffffffffff5ec;
  int in_stack_fffffffffffff5f0;
  int in_stack_fffffffffffff5f4;
  BATType local_984;
  undefined1 local_8e0 [232];
  Geometry *in_stack_fffffffffffff808;
  TagBoxArray *in_stack_fffffffffffff810;
  int local_7e0;
  BATType local_7dc;
  undefined1 local_7d8 [104];
  undefined1 local_770 [388];
  IntVect local_5ec;
  IntVect local_5e0;
  int local_5d4;
  undefined1 local_498 [96];
  int local_438;
  element_type *local_430;
  int local_428;
  BATType local_3fc;
  _Type local_3b8;
  undefined8 local_3a8;
  int local_3a0;
  undefined8 local_2f4;
  undefined1 local_2ec [8];
  undefined8 local_2e4;
  IndexType local_2dc;
  BATType local_2d8;
  int local_2d4;
  BATType local_2d0;
  int local_2cc [25];
  undefined1 local_268 [24];
  int local_250;
  uint local_24c;
  BATType *local_240;
  undefined8 local_238;
  BATType local_22c;
  int local_21c;
  IntVect *local_218;
  int local_20c;
  IntVect *local_208;
  int local_1fc;
  IntVect *local_1f8;
  int local_1ec;
  IntVect *local_1e8;
  int local_1dc;
  IntVect *local_1d8;
  int local_1cc;
  IntVect *local_1c8;
  int local_1bc;
  IntVect *local_1b8;
  int local_1ac;
  IntVect *local_1a8;
  char *local_1a0;
  char *local_198;
  IntVect *local_190;
  Box *local_188;
  IntVect *local_180;
  BoxArray *local_178;
  int local_170;
  IntVect local_16c;
  IntVect *local_160;
  undefined8 *local_158;
  int local_14c;
  undefined1 *local_148;
  undefined4 local_13c;
  IntVect *local_138;
  int local_12c;
  IntVect *local_128;
  IntVect *local_120;
  undefined1 *local_118;
  undefined4 local_10c;
  IntVect *local_108;
  undefined4 local_fc;
  IntVect *local_f8;
  undefined4 local_ec;
  IntVect *local_e8;
  int local_dc;
  IndexType *local_d8;
  int local_cc;
  IndexType *local_c8;
  int local_bc;
  IntVect *local_b8;
  IntVect *local_b0;
  IntVect *local_a8;
  undefined1 *local_a0;
  IntVect *local_98;
  undefined8 *local_90;
  IndexType *local_88;
  undefined4 local_80;
  int local_7c;
  IntVect *local_78;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  TagVal local_5c;
  TagVal local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  local_250 = (in_RDI->super_AmrInfo).max_level + -1;
  local_240 = in_RDX;
  local_238 = in_XMM0_Qa;
  local_22c = in_ESI;
  puVar7 = (uint *)std::min<int>((int *)&(in_RDI->super_AmrInfo).field_0x8c,&local_250);
  local_24c = *puVar7;
  LVar8 = Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::size
                    ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)0x1376ce9);
  if (LVar8 < (int)(local_24c + 2)) {
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::resize
              ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_fffffffffffff440,
               CONCAT44(in_stack_fffffffffffff43c,in_stack_fffffffffffff438));
  }
  std::allocator<amrex::IntVect>::allocator((allocator<amrex::IntVect> *)0x1376d3e);
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::vector
            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)in_stack_fffffffffffff420,
             (size_type)in_stack_fffffffffffff418,(allocator_type *)0x1376d5b);
  std::allocator<amrex::IntVect>::~allocator((allocator<amrex::IntVect> *)0x1376d6a);
  std::allocator<amrex::IntVect>::allocator((allocator<amrex::IntVect> *)0x1376d93);
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::vector
            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)in_stack_fffffffffffff420,
             (size_type)in_stack_fffffffffffff418,(allocator_type *)0x1376db0);
  std::allocator<amrex::IntVect>::~allocator((allocator<amrex::IntVect> *)0x1376dbf);
  std::allocator<amrex::Box>::allocator((allocator<amrex::Box> *)0x1376de8);
  Vector<amrex::Box,_std::allocator<amrex::Box>_>::vector
            ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_stack_fffffffffffff420,
             (size_type)in_stack_fffffffffffff418,(allocator_type *)0x1376e05);
  std::allocator<amrex::Box>::~allocator((allocator<amrex::Box> *)0x1376e14);
  for (local_2cc[3] = 0; local_2cc[3] <= (int)local_24c; local_2cc[3] = local_2cc[3] + 1) {
    for (local_2cc[2] = 0; local_2cc[2] < 3; local_2cc[2] = local_2cc[2] + 1) {
      local_2cc[1] = 1;
      local_1a8 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
      local_1ac = local_2cc[2];
      iVar14 = local_1a8->vect[local_2cc[2]];
      local_1b8 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
      local_1bc = local_2cc[2];
      local_2cc[0] = iVar14 / local_1b8->vect[local_2cc[2]];
      piVar9 = std::max<int>(local_2cc + 1,local_2cc);
      iVar14 = *piVar9;
      local_1c8 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
      local_1cc = local_2cc[2];
      local_1c8->vect[local_2cc[2]] = iVar14;
    }
  }
  for (local_2d0 = local_22c; (int)local_2d0 < (int)local_24c; local_2d0 = local_2d0 + indexType) {
    for (local_2d4 = 0; local_2d4 < 3; local_2d4 = local_2d4 + 1) {
      local_1d8 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
      local_1dc = local_2d4;
      iVar14 = local_1d8->vect[local_2d4];
      local_1e8 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
      local_1ec = local_2d4;
      iVar5 = local_1e8->vect[local_2d4];
      local_1f8 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
      local_1fc = local_2d4;
      iVar6 = local_1f8->vect[local_2d4];
      local_208 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
      local_20c = local_2d4;
      local_208->vect[local_2d4] = (iVar14 * iVar5) / iVar6;
    }
  }
  for (local_2d8 = local_22c; (int)local_2d8 <= (int)local_24c; local_2d8 = local_2d8 + indexType) {
    pGVar10 = Geom(in_stack_fffffffffffff420,(int)((ulong)in_stack_fffffffffffff418 >> 0x20));
    pBVar11 = Geometry::Domain(pGVar10);
    local_190 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                          ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                           in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
    lVar1 = *(long *)(pBVar11->smallend).vect;
    lVar2 = *(long *)((pBVar11->smallend).vect + 2);
    lVar3 = *(long *)((pBVar11->bigend).vect + 1);
    local_2dc.itype = (pBVar11->btype).itype;
    local_158 = &local_2f4;
    local_13c = 1;
    bVar15 = true;
    if ((local_190->vect[0] == 1) && (bVar15 = true, local_190->vect[1] == 1)) {
      bVar15 = local_190->vect[2] != 1;
    }
    local_2f4 = lVar1;
    local_2ec = (undefined1  [8])lVar2;
    local_2e4 = lVar3;
    local_188 = pBVar11;
    local_160 = local_190;
    local_138 = local_190;
    if (bVar15) {
      local_2f4._0_4_ = (int)lVar1;
      local_50 = (int)local_2f4;
      local_54 = local_190->vect[0];
      local_4c = local_50;
      if (local_54 != 1) {
        if (local_54 == 2) {
          if ((int)local_2f4 < 0) {
            iVar14 = (int)local_2f4 + 1;
            if (iVar14 < 1) {
              iVar14 = -iVar14;
            }
            in_stack_fffffffffffff5f4 = -iVar14 / 2 + -1;
            local_4c = in_stack_fffffffffffff5f4;
          }
          else {
            in_stack_fffffffffffff5f4 = (int)local_2f4 / 2;
            local_4c = in_stack_fffffffffffff5f4;
          }
        }
        else if (local_54 == 4) {
          if ((int)local_2f4 < 0) {
            iVar14 = (int)local_2f4 + 1;
            if (iVar14 < 1) {
              iVar14 = -iVar14;
            }
            in_stack_fffffffffffff5f0 = -iVar14 / 4 + -1;
            local_4c = in_stack_fffffffffffff5f0;
          }
          else {
            in_stack_fffffffffffff5f0 = (int)local_2f4 / 4;
            local_4c = in_stack_fffffffffffff5f0;
          }
        }
        else if ((int)local_2f4 < 0) {
          iVar14 = (int)local_2f4 + 1;
          if (iVar14 < 1) {
            iVar14 = -iVar14;
          }
          in_stack_fffffffffffff5ec = -iVar14 / local_54 + -1;
          local_4c = in_stack_fffffffffffff5ec;
        }
        else {
          in_stack_fffffffffffff5ec = (int)local_2f4 / local_54;
          local_4c = in_stack_fffffffffffff5ec;
        }
      }
      local_2f4._4_4_ = (TagVal)((ulong)lVar1 >> 0x20);
      local_5c = local_2f4._4_4_;
      local_2f4._0_4_ = local_4c;
      in_stack_fffffffffffff5e8 = local_190->vect[1];
      local_58 = local_5c;
      if (in_stack_fffffffffffff5e8 != 1) {
        if (in_stack_fffffffffffff5e8 == 2) {
          if (lVar1 < 0) {
            iVar14 = local_5c + BUF;
            if (iVar14 < 1) {
              iVar14 = -iVar14;
            }
            in_stack_fffffffffffff5e4 = -iVar14 / 2 - BUF;
            local_58 = in_stack_fffffffffffff5e4;
          }
          else {
            in_stack_fffffffffffff5e4 = (int)local_5c / 2;
            local_58 = in_stack_fffffffffffff5e4;
          }
        }
        else if (in_stack_fffffffffffff5e8 == 4) {
          if (lVar1 < 0) {
            iVar14 = local_5c + BUF;
            if (iVar14 < 1) {
              iVar14 = -iVar14;
            }
            local_a20 = -iVar14 / 4 - BUF;
          }
          else {
            local_a20 = (int)local_5c / 4;
          }
          local_58 = local_a20;
        }
        else {
          if (lVar1 < 0) {
            iVar14 = local_5c + BUF;
            if (iVar14 < 1) {
              iVar14 = -iVar14;
            }
            local_a24 = -iVar14 / in_stack_fffffffffffff5e8 - BUF;
          }
          else {
            local_a24 = (int)local_5c / in_stack_fffffffffffff5e8;
          }
          local_58 = local_a24;
        }
      }
      local_2f4._4_4_ = local_58;
      local_2ec._0_4_ = (undefined4)lVar2;
      local_68 = local_2ec._0_4_;
      local_6c = local_190->vect[2];
      local_64 = local_68;
      if (local_6c != 1) {
        if (local_6c == 2) {
          if ((int)local_2ec._0_4_ < 0) {
            iVar14 = local_2ec._0_4_ + 1;
            if (iVar14 < 1) {
              iVar14 = -iVar14;
            }
            local_a2c = -iVar14 / 2 + -1;
          }
          else {
            local_a2c = (int)local_2ec._0_4_ / 2;
          }
          local_64 = local_a2c;
        }
        else if (local_6c == 4) {
          if ((int)local_2ec._0_4_ < 0) {
            iVar14 = local_2ec._0_4_ + 1;
            if (iVar14 < 1) {
              iVar14 = -iVar14;
            }
            local_a30 = -iVar14 / 4 + -1;
          }
          else {
            local_a30 = (int)local_2ec._0_4_ / 4;
          }
          local_64 = local_a30;
        }
        else if ((int)local_2ec._0_4_ < 0) {
          iVar14 = local_2ec._0_4_ + 1;
          if (iVar14 < 1) {
            iVar14 = -iVar14;
          }
          in_stack_fffffffffffff5cc = -iVar14 / local_6c + -1;
          local_64 = in_stack_fffffffffffff5cc;
        }
        else {
          in_stack_fffffffffffff5cc = (int)local_2ec._0_4_ / local_6c;
          local_64 = in_stack_fffffffffffff5cc;
        }
      }
      local_2ec._4_4_ = (undefined4)((ulong)lVar2 >> 0x20);
      uVar4 = local_2ec._4_4_;
      local_2ec._0_4_ = local_64;
      local_88 = &local_2dc;
      local_98 = local_190;
      local_90 = local_158;
      local_60 = in_stack_fffffffffffff5e8;
      if (local_2dc.itype == 0) {
        local_a0 = local_2ec + 4;
        local_2c = uVar4;
        local_30 = local_190->vect[0];
        local_28 = local_2c;
        if (local_30 != 1) {
          if (local_30 == 2) {
            if (lVar2 < 0) {
              iVar14 = uVar4 + 1;
              if (iVar14 < 1) {
                iVar14 = -iVar14;
              }
              local_a7c = -iVar14 / 2 + -1;
            }
            else {
              local_a7c = (int)uVar4 / 2;
            }
            local_28 = local_a7c;
          }
          else if (local_30 == 4) {
            if (lVar2 < 0) {
              iVar14 = uVar4 + 1;
              if (iVar14 < 1) {
                iVar14 = -iVar14;
              }
              local_a80 = -iVar14 / 4 + -1;
            }
            else {
              local_a80 = (int)uVar4 / 4;
            }
            local_28 = local_a80;
          }
          else {
            if (lVar2 < 0) {
              iVar14 = uVar4 + 1;
              if (iVar14 < 1) {
                iVar14 = -iVar14;
              }
              local_a84 = -iVar14 / local_30 + -1;
            }
            else {
              local_a84 = (int)uVar4 / local_30;
            }
            local_28 = local_a84;
          }
        }
        local_2ec._4_4_ = local_28;
        local_2e4._0_4_ = (int)lVar3;
        local_38 = (int)local_2e4;
        local_3c = local_190->vect[1];
        local_34 = local_38;
        if (local_3c != 1) {
          if (local_3c == 2) {
            if ((int)local_2e4 < 0) {
              iVar14 = (int)local_2e4 + 1;
              if (iVar14 < 1) {
                iVar14 = -iVar14;
              }
              local_a8c = -iVar14 / 2 + -1;
            }
            else {
              local_a8c = (int)local_2e4 / 2;
            }
            local_34 = local_a8c;
          }
          else if (local_3c == 4) {
            if ((int)local_2e4 < 0) {
              iVar14 = (int)local_2e4 + 1;
              if (iVar14 < 1) {
                iVar14 = -iVar14;
              }
              local_a90 = -iVar14 / 4 + -1;
            }
            else {
              local_a90 = (int)local_2e4 / 4;
            }
            local_34 = local_a90;
          }
          else {
            if ((int)local_2e4 < 0) {
              iVar14 = (int)local_2e4 + 1;
              if (iVar14 < 1) {
                iVar14 = -iVar14;
              }
              local_a94 = -iVar14 / local_3c + -1;
            }
            else {
              local_a94 = (int)local_2e4 / local_3c;
            }
            local_34 = local_a94;
          }
        }
        local_2e4._4_4_ = (int)((ulong)lVar3 >> 0x20);
        local_44 = local_2e4._4_4_;
        local_2e4._0_4_ = local_34;
        local_48 = local_190->vect[2];
        local_40 = local_44;
        if (local_48 != 1) {
          if (local_48 == 2) {
            if (lVar3 < 0) {
              iVar14 = local_44 + 1;
              if (iVar14 < 1) {
                iVar14 = -iVar14;
              }
              local_a9c = -iVar14 / 2 + -1;
            }
            else {
              local_a9c = local_44 / 2;
            }
            local_40 = local_a9c;
          }
          else if (local_48 == 4) {
            if (lVar3 < 0) {
              iVar14 = local_44 + 1;
              if (iVar14 < 1) {
                iVar14 = -iVar14;
              }
              local_aa0 = -iVar14 / 4 + -1;
            }
            else {
              local_aa0 = local_44 / 4;
            }
            local_40 = local_aa0;
          }
          else {
            if (lVar3 < 0) {
              iVar14 = local_44 + 1;
              if (iVar14 < 1) {
                iVar14 = -iVar14;
              }
              local_aa4 = -iVar14 / local_48 + -1;
            }
            else {
              local_aa4 = local_44 / local_48;
            }
            local_40 = local_aa4;
          }
        }
        local_2e4._4_4_ = local_40;
        local_2ec = local_2ec;
        local_2e4 = local_2e4;
        local_a8 = local_190;
      }
      else {
        IntVect::IntVect(&local_16c,0);
        lVar1 = local_2e4;
        for (local_170 = 0; local_170 < 3; local_170 = local_170 + 1) {
          local_d8 = &local_2dc;
          local_dc = local_170;
          local_cc = local_170;
          local_bc = local_170;
          if ((local_2dc.itype & 1 << ((byte)local_170 & 0x1f)) != 0) {
            local_148 = local_2ec + 4;
            local_14c = local_170;
            local_128 = local_160;
            local_12c = local_170;
            if (*(int *)(local_148 + (long)local_170 * 4) % local_160->vect[local_170] != 0) {
              local_78 = &local_16c;
              local_7c = local_170;
              local_80 = 1;
              local_78->vect[local_170] = 1;
            }
          }
          local_c8 = local_d8;
        }
        in_stack_fffffffffffff5c0 = (IntVect *)(local_2ec + 4);
        local_b8 = local_160;
        local_8 = local_2ec._4_4_;
        in_stack_fffffffffffff5c8 = local_160->vect[0];
        local_4 = local_8;
        if (in_stack_fffffffffffff5c8 != 1) {
          if (in_stack_fffffffffffff5c8 == 2) {
            if ((long)local_2ec < 0) {
              iVar14 = local_2ec._4_4_ + 1;
              if (iVar14 < 1) {
                iVar14 = -iVar14;
              }
              in_stack_fffffffffffff5bc = -iVar14 / 2 + -1;
              local_4 = in_stack_fffffffffffff5bc;
            }
            else {
              in_stack_fffffffffffff5bc = (int)local_2ec._4_4_ / 2;
              local_4 = in_stack_fffffffffffff5bc;
            }
          }
          else if (in_stack_fffffffffffff5c8 == 4) {
            if ((long)local_2ec < 0) {
              iVar14 = local_2ec._4_4_ + 1;
              if (iVar14 < 1) {
                iVar14 = -iVar14;
              }
              in_stack_fffffffffffff5b8 = -iVar14 / 4 + -1;
              local_4 = in_stack_fffffffffffff5b8;
            }
            else {
              in_stack_fffffffffffff5b8 = (int)local_2ec._4_4_ / 4;
              local_4 = in_stack_fffffffffffff5b8;
            }
          }
          else {
            if ((long)local_2ec < 0) {
              iVar14 = local_2ec._4_4_ + 1;
              if (iVar14 < 1) {
                iVar14 = -iVar14;
              }
              local_a4c = -iVar14 / in_stack_fffffffffffff5c8 + -1;
            }
            else {
              local_a4c = (int)local_2ec._4_4_ / in_stack_fffffffffffff5c8;
            }
            local_4 = local_a4c;
          }
        }
        local_2ec._4_4_ = local_4;
        local_14 = (int)local_2e4;
        local_18 = local_160->vect[1];
        local_10 = local_14;
        if (local_18 != 1) {
          if (local_18 == 2) {
            if ((int)local_2e4 < 0) {
              iVar14 = (int)local_2e4 + 1;
              if (iVar14 < 1) {
                iVar14 = -iVar14;
              }
              local_a54 = -iVar14 / 2 + -1;
            }
            else {
              local_a54 = (int)local_2e4 / 2;
            }
            local_10 = local_a54;
          }
          else if (local_18 == 4) {
            if ((int)local_2e4 < 0) {
              iVar14 = (int)local_2e4 + 1;
              if (iVar14 < 1) {
                iVar14 = -iVar14;
              }
              local_a58 = -iVar14 / 4 + -1;
            }
            else {
              local_a58 = (int)local_2e4 / 4;
            }
            local_10 = local_a58;
          }
          else {
            if ((int)local_2e4 < 0) {
              iVar14 = (int)local_2e4 + 1;
              if (iVar14 < 1) {
                iVar14 = -iVar14;
              }
              local_a5c = -iVar14 / local_18 + -1;
            }
            else {
              local_a5c = (int)local_2e4 / local_18;
            }
            local_10 = local_a5c;
          }
        }
        local_20 = local_2e4._4_4_;
        local_2e4._0_4_ = local_10;
        local_24 = local_160->vect[2];
        local_1c = local_20;
        if (local_24 != 1) {
          if (local_24 == 2) {
            if (lVar1 < 0) {
              iVar14 = local_20 + 1;
              if (iVar14 < 1) {
                iVar14 = -iVar14;
              }
              local_a64 = -iVar14 / 2 + -1;
            }
            else {
              local_a64 = local_20 / 2;
            }
            local_1c = local_a64;
          }
          else if (local_24 == 4) {
            if (lVar1 < 0) {
              iVar14 = local_20 + 1;
              if (iVar14 < 1) {
                iVar14 = -iVar14;
              }
              local_a68 = -iVar14 / 4 + -1;
            }
            else {
              local_a68 = local_20 / 4;
            }
            local_1c = local_a68;
          }
          else {
            if (lVar1 < 0) {
              iVar14 = local_20 + 1;
              if (iVar14 < 1) {
                iVar14 = -iVar14;
              }
              local_a6c = -iVar14 / local_24 + -1;
            }
            else {
              local_a6c = local_20 / local_24;
            }
            local_1c = local_a6c;
          }
        }
        local_2e4._4_4_ = local_1c;
        local_118 = local_2ec + 4;
        local_120 = &local_16c;
        local_ec = 0;
        local_2ec._4_4_ = local_16c.vect[0] + local_2ec._4_4_;
        local_fc = 1;
        iVar14 = local_2e4._4_4_;
        local_2e4._0_4_ = local_16c.vect[1] + (int)local_2e4;
        local_10c = 2;
        local_2e4._4_4_ = local_16c.vect[2] + iVar14;
        local_2ec = local_2ec;
        local_2e4 = local_2e4;
        local_108 = local_120;
        local_f8 = local_120;
        local_e8 = local_120;
        local_b0 = in_stack_fffffffffffff5c0;
        local_c = in_stack_fffffffffffff5c8;
      }
    }
    pBVar11 = Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                        ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                         in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
    *(long *)(pBVar11->smallend).vect = local_2f4;
    *(undefined1 (*) [8])((pBVar11->smallend).vect + 2) = local_2ec;
    *(long *)((pBVar11->bigend).vect + 1) = local_2e4;
    (pBVar11->btype).itype = local_2dc.itype;
  }
  std::allocator<amrex::BoxArray>::allocator((allocator<amrex::BoxArray> *)0x1378427);
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
            ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)in_stack_fffffffffffff420,
             (size_type)in_stack_fffffffffffff418,(allocator_type *)0x1378444);
  std::allocator<amrex::BoxArray>::~allocator((allocator<amrex::BoxArray> *)0x1378453);
  std::allocator<amrex::BoxArray>::allocator((allocator<amrex::BoxArray> *)0x137847c);
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
            ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)in_stack_fffffffffffff420,
             (size_type)in_stack_fffffffffffff418,(allocator_type *)0x1378499);
  std::allocator<amrex::BoxArray>::~allocator((allocator<amrex::BoxArray> *)0x13784a8);
  BoxList::BoxList((BoxList *)in_stack_fffffffffffff418);
  BoxList::BoxList((BoxList *)in_stack_fffffffffffff418);
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
            ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)in_stack_fffffffffffff420,
             (size_type)in_stack_fffffffffffff418);
  this_00 = BoxArray::simplified_list
                      ((BoxArray *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
  BoxList::BoxList((BoxList *)in_stack_fffffffffffff420,(BoxList *)in_stack_fffffffffffff418);
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)in_stack_fffffffffffff420,
             (size_type)in_stack_fffffffffffff418);
  BoxList::coarsen(in_stack_fffffffffffff508,in_stack_fffffffffffff500);
  Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
            ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_stack_fffffffffffff420,
             (size_type)in_stack_fffffffffffff418);
  BoxList::parallelComplementIn
            ((BoxList *)in_stack_fffffffffffff4c0,
             (Box *)CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8.itype),
             (BoxList *)CONCAT44(in_stack_fffffffffffff4b4.itype,in_stack_fffffffffffff4b0));
  BoxList::clear((BoxList *)0x137856e);
  BoxList::simplify((BoxList *)in_stack_fffffffffffff440,SUB41(in_stack_fffffffffffff43c >> 0x18,0))
  ;
  BoxList::accrete((BoxList *)in_stack_fffffffffffff440,in_stack_fffffffffffff43c);
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
            ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)in_stack_fffffffffffff420,
             (size_type)in_stack_fffffffffffff418);
  bVar15 = Geometry::isAnyPeriodic((Geometry *)in_stack_fffffffffffff420);
  if (bVar15) {
    in_stack_fffffffffffff528 =
         (BoxArray *)
         Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                   ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_stack_fffffffffffff420,
                    (size_type)in_stack_fffffffffffff418);
    pGVar10 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                        ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                         in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
    AVar16 = Geometry::isPeriodic(pGVar10);
    local_3b8[2] = AVar16._M_elems[2];
    local_3a0 = local_3b8[2];
    local_3b8._0_8_ = AVar16._M_elems._0_8_;
    local_3a8._0_4_ = local_3b8[0];
    local_3a8._4_4_ = local_3b8[1];
    local_3b8 = AVar16._M_elems;
    ProjPeriodic(in_stack_fffffffffffff4d0,
                 (Box *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
                 (Array<int,_3> *)in_stack_fffffffffffff4c0);
  }
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
            ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)in_stack_fffffffffffff420,
             (size_type)in_stack_fffffffffffff418);
  BoxArray::define((BoxArray *)in_stack_fffffffffffff470,(BoxList *)in_stack_fffffffffffff468);
  BoxList::BoxList((BoxList *)in_stack_fffffffffffff418);
  BoxList::operator=((BoxList *)in_stack_fffffffffffff420,(BoxList *)in_stack_fffffffffffff418);
  BoxList::~BoxList((BoxList *)0x1378768);
  Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
            ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_stack_fffffffffffff420,
             (size_type)in_stack_fffffffffffff418);
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
            ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)in_stack_fffffffffffff420,
             (size_type)in_stack_fffffffffffff418);
  BoxList::parallelComplementIn
            ((BoxList *)in_stack_fffffffffffff420,(Box *)in_stack_fffffffffffff418,
             (BoxArray *)0x13787b2);
  BoxList::simplify((BoxList *)in_stack_fffffffffffff440,SUB41(in_stack_fffffffffffff43c >> 0x18,0))
  ;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
            ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)in_stack_fffffffffffff420,
             (size_type)in_stack_fffffffffffff418);
  BoxArray::define((BoxArray *)in_stack_fffffffffffff470,(BoxList *)in_stack_fffffffffffff468);
  BoxList::BoxList((BoxList *)in_stack_fffffffffffff418);
  BoxList::operator=((BoxList *)in_stack_fffffffffffff420,(BoxList *)in_stack_fffffffffffff418);
  BoxList::~BoxList((BoxList *)0x137881b);
  local_3fc = local_22c;
  while (local_3fc = local_3fc + indexType, (int)local_3fc <= (int)local_24c) {
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
    BoxArray::boxList((BoxArray *)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8));
    BoxList::operator=((BoxList *)in_stack_fffffffffffff420,(BoxList *)in_stack_fffffffffffff418);
    BoxList::~BoxList((BoxList *)0x137889d);
    BoxList::simplify((BoxList *)in_stack_fffffffffffff440,
                      SUB41(in_stack_fffffffffffff43c >> 0x18,0));
    Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
              ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)in_stack_fffffffffffff420,
               (size_type)in_stack_fffffffffffff418);
    BoxList::refine((BoxList *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460),
                    in_stack_fffffffffffff458);
    BoxList::accrete((BoxList *)in_stack_fffffffffffff440,in_stack_fffffffffffff43c);
    Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
    bVar15 = Geometry::isAnyPeriodic((Geometry *)in_stack_fffffffffffff420);
    if (bVar15) {
      Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_stack_fffffffffffff420,
                 (size_type)in_stack_fffffffffffff418);
      pGVar10 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                          ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                           in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
      join_0x00000010_0x00000000_ = Geometry::isPeriodic(pGVar10);
      local_428 = local_438;
      local_430 = (element_type *)local_498._88_8_;
      ProjPeriodic(in_stack_fffffffffffff4d0,
                   (Box *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
                   (Array<int,_3> *)in_stack_fffffffffffff4c0);
    }
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
    BoxArray::define((BoxArray *)in_stack_fffffffffffff470,(BoxList *)in_stack_fffffffffffff468);
    BoxList::BoxList((BoxList *)in_stack_fffffffffffff418);
    BoxList::operator=((BoxList *)in_stack_fffffffffffff420,(BoxList *)in_stack_fffffffffffff418);
    BoxList::~BoxList((BoxList *)0x1378a0d);
    Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
              ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_stack_fffffffffffff420,
               (size_type)in_stack_fffffffffffff418);
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
    BoxList::parallelComplementIn
              ((BoxList *)in_stack_fffffffffffff420,(Box *)in_stack_fffffffffffff418,
               (BoxArray *)0x1378a57);
    BoxList::simplify((BoxList *)in_stack_fffffffffffff440,
                      SUB41(in_stack_fffffffffffff43c >> 0x18,0));
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
    BoxArray::define((BoxArray *)in_stack_fffffffffffff470,(BoxList *)in_stack_fffffffffffff468);
    BoxList::BoxList((BoxList *)in_stack_fffffffffffff418);
    BoxList::operator=((BoxList *)in_stack_fffffffffffff420,(BoxList *)in_stack_fffffffffffff418);
    BoxList::~BoxList((BoxList *)0x1378ac0);
  }
  *local_240 = local_22c;
  for (local_498._20_4_ = local_24c; (int)local_22c <= (int)local_498._20_4_;
      local_498._20_4_ = local_498._20_4_ - 1) {
    local_498._16_4_ = local_498._20_4_ + 1;
    pIVar12 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                        ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                         in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
    local_498._8_4_ = pIVar12->vect[2];
    local_498._0_8_ = *(undefined8 *)pIVar12->vect;
    BoxArray::BoxArray((BoxArray *)in_stack_fffffffffffff420);
    if ((int)local_498._16_4_ < (int)*local_240) {
      Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                 in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
      BoxArray::simplified
                ((BoxArray *)CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8.itype));
      BoxArray::operator=((BoxArray *)in_stack_fffffffffffff420,in_stack_fffffffffffff418);
      BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffff420);
      Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                 in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
      BoxArray::coarsen(in_stack_fffffffffffff468,
                        (IntVect *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
      Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                 in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
      BoxArray::growcoarsen
                ((BoxArray *)in_stack_fffffffffffff440,in_stack_fffffffffffff43c,
                 (IntVect *)in_stack_fffffffffffff430);
      Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                 in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
      BoxArray::simplified
                ((BoxArray *)CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8.itype));
      local_5d4 = 0;
      while( true ) {
        IntVect::IntVect(&local_5e0,0);
        bVar15 = BoxArray::contains(in_stack_fffffffffffff498,in_stack_fffffffffffff490,
                                    SUB81((ulong)in_stack_fffffffffffff488 >> 0x38,0),
                                    (IntVect *)in_stack_fffffffffffff480);
        if (((bVar15 ^ 0xffU) & 1) == 0) break;
        BoxArray::grow(in_stack_fffffffffffff430,in_stack_fffffffffffff42c);
        local_5d4 = local_5d4 + 1;
      }
      IntVect::IntVect(&local_5ec,local_5d4);
      in_stack_fffffffffffff4c0 = (BoxArray *)local_498;
      local_180 = &local_5ec;
      in_stack_fffffffffffff4bc = local_5ec.vect[0];
      if (local_5ec.vect[0] < (int)local_498._0_4_) {
        in_stack_fffffffffffff4bc = local_498._0_4_;
      }
      uVar4 = local_498._4_4_;
      local_498._0_4_ = in_stack_fffffffffffff4bc;
      in_stack_fffffffffffff4b8.itype = local_5ec.vect[1];
      if (local_5ec.vect[1] < (int)uVar4) {
        in_stack_fffffffffffff4b8.itype = local_498._4_4_;
      }
      local_498._4_4_ = in_stack_fffffffffffff4b8.itype;
      in_stack_fffffffffffff4b4.itype = local_5ec.vect[2];
      if (local_5ec.vect[2] < (int)local_498._8_4_) {
        in_stack_fffffffffffff4b4.itype = local_498._8_4_;
      }
      local_498._8_4_ = in_stack_fffffffffffff4b4.itype;
      local_178 = in_stack_fffffffffffff4c0;
      BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffff420);
    }
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
    Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
    TagBoxArray::TagBoxArray
              ((TagBoxArray *)CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
               in_stack_fffffffffffff498,(DistributionMapping *)in_stack_fffffffffffff490,
               in_stack_fffffffffffff488);
    bVar15 = useFixedCoarseGrids(in_RDI);
    if ((!bVar15) ||
       (in_stack_fffffffffffff4a4 = local_498._20_4_, iVar14 = useFixedUpToLevel(in_RDI),
       iVar14 <= (int)in_stack_fffffffffffff4a4)) {
      (*in_RDI->_vptr_AmrMesh[3])(local_238,in_RDI,(ulong)(uint)local_498._20_4_,local_770,0);
    }
    Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
              ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)in_stack_fffffffffffff420,
               (size_type)in_stack_fffffffffffff418);
    TagBoxArray::buffer((TagBoxArray *)in_stack_fffffffffffff490,in_stack_fffffffffffff488);
    bVar15 = useFixedCoarseGrids(in_RDI);
    if (bVar15) {
      in_stack_fffffffffffff4a0 = local_498._20_4_;
      iVar14 = useFixedUpToLevel(in_RDI);
      if ((int)in_stack_fffffffffffff4a0 < iVar14) {
        in_stack_fffffffffffff498 =
             (BoxArray *)std::max<int>((int *)local_240,(int *)(local_498 + 0x10));
        *local_240 = (in_stack_fffffffffffff498->m_bat).m_bat_type;
      }
      else {
        (*in_RDI->_vptr_AmrMesh[6])(local_7d8,in_RDI,(ulong)(uint)local_498._20_4_);
        TagBoxArray::setVal((TagBoxArray *)
                            CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                            (BoxArray *)
                            CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8),
                            in_stack_fffffffffffff5e4);
        BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffff420);
      }
    }
    local_7dc = null;
    for (local_7e0 = 0; local_7e0 < 3; local_7e0 = local_7e0 + 1) {
      local_218 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
      local_21c = local_7e0;
      in_stack_fffffffffffff490 =
           (BoxArray *)std::max<int>((int *)&local_7dc,local_218->vect + local_7e0);
      local_7dc = (in_stack_fffffffffffff490->m_bat).m_bat_type;
    }
    if ((int)local_7dc < 1) {
      local_198 = "blocking factor is too small relative to ref_ratio";
      Abort_host((char *)in_stack_fffffffffffff430);
    }
    else {
      Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                 in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
      TagBoxArray::coarsen
                ((TagBoxArray *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                 in_stack_fffffffffffff5c0);
    }
    (*in_RDI->_vptr_AmrMesh[4])(in_RDI,(ulong)(uint)local_498._20_4_,local_770,local_268);
    if ((int)local_498._16_4_ < (int)*local_240) {
      Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                 in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
      BoxArray::coarsen(in_stack_fffffffffffff468,
                        (IntVect *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
      TagBoxArray::setVal((TagBoxArray *)
                          CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                          (BoxArray *)CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8),
                          in_stack_fffffffffffff5e4);
    }
    in_stack_fffffffffffff470 =
         (AmrMesh *)
         Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                   ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_stack_fffffffffffff420,
                    (size_type)in_stack_fffffffffffff418);
    pGVar10 = Geom(in_stack_fffffffffffff420,(int)((ulong)in_stack_fffffffffffff418 >> 0x20));
    in_stack_fffffffffffff480 = (BoxArray *)Geometry::ProbDomain(pGVar10);
    pGVar10 = Geom(in_stack_fffffffffffff420,(int)((ulong)in_stack_fffffffffffff418 >> 0x20));
    iVar14 = CoordSys::CoordInt(&pGVar10->super_CoordSys);
    pGVar10 = Geom(in_stack_fffffffffffff420,(int)((ulong)in_stack_fffffffffffff418 >> 0x20));
    local_8e0._24_12_ = (undefined1  [12])Geometry::isPeriodic(pGVar10);
    local_8e0._48_4_ = local_8e0._32_4_;
    local_8e0._40_8_ = local_8e0._24_8_;
    in_stack_fffffffffffff488 = (IntVect *)(local_8e0 + 0x38);
    Geometry::Geometry(in_stack_fffffffffffff440,
                       (Box *)CONCAT44(in_stack_fffffffffffff43c,in_stack_fffffffffffff438),
                       (RealBox *)in_stack_fffffffffffff430,in_stack_fffffffffffff42c,
                       (Array<int,_3> *)in_stack_fffffffffffff420);
    TagBoxArray::mapPeriodicRemoveDuplicates(in_stack_fffffffffffff810,in_stack_fffffffffffff808);
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
    TagBoxArray::setVal((TagBoxArray *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0)
                        ,(BoxArray *)CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8),
                        in_stack_fffffffffffff5e4);
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
    BoxArray::clear(in_stack_fffffffffffff480);
    in_stack_fffffffffffff468 = (BoxArray *)local_8e0;
    PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::PODVector
              ((PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
               in_stack_fffffffffffff420);
    TagBoxArray::collate
              ((TagBoxArray *)CONCAT44(iVar14,in_stack_fffffffffffff478),
               (PinnedVector<IntVect> *)in_stack_fffffffffffff470);
    FabArray<amrex::TagBox>::clear
              ((FabArray<amrex::TagBox> *)
               CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
    sVar13 = PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::size
                       ((PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)local_8e0);
    if (sVar13 != 0) {
      bVar15 = useFixedCoarseGrids(in_RDI);
      if ((!bVar15) ||
         (in_stack_fffffffffffff464 = local_498._20_4_, iVar5 = useFixedUpToLevel(in_RDI),
         iVar5 <= (int)in_stack_fffffffffffff464)) {
        in_stack_fffffffffffff458 =
             (IntVect *)std::max<int>((int *)local_240,(int *)(local_498 + 0x10));
        *local_240 = in_stack_fffffffffffff458->vect[0];
      }
      iVar5 = local_498._16_4_;
      iVar6 = useFixedUpToLevel(in_RDI);
      if (iVar6 < iVar5) {
        BoxList::BoxList((BoxList *)in_stack_fffffffffffff418);
        bVar15 = ParallelDescriptor::IOProcessor();
        if (bVar15) {
          in_stack_fffffffffffff440 = (Geometry *)local_8e0;
          pIVar12 = PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                              ((PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                               in_stack_fffffffffffff440,0);
          PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::size
                    ((PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                     in_stack_fffffffffffff440);
          ClusterList::ClusterList
                    ((ClusterList *)CONCAT44(iVar5,in_stack_fffffffffffff450),pIVar12,
                     (Long)in_stack_fffffffffffff440);
          if (((in_RDI->super_AmrInfo).use_new_chop & 1U) == 0) {
            ClusterList::chop((ClusterList *)in_stack_fffffffffffff440,
                              (Real)CONCAT44(in_stack_fffffffffffff43c,in_stack_fffffffffffff438));
          }
          else {
            ClusterList::new_chop
                      ((ClusterList *)in_stack_fffffffffffff440,
                       (Real)CONCAT44(in_stack_fffffffffffff43c,in_stack_fffffffffffff438));
          }
          Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                    ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                     in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
          ClusterList::intersect((ClusterList *)this_00,in_stack_fffffffffffff528);
          ClusterList::boxList
                    ((ClusterList *)in_stack_fffffffffffff440,
                     (BoxList *)CONCAT44(in_stack_fffffffffffff43c,in_stack_fffffffffffff438));
          Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                    ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                     in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
          BoxList::refine((BoxList *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460),
                          in_stack_fffffffffffff458);
          BoxList::simplify((BoxList *)in_stack_fffffffffffff440,
                            SUB41(in_stack_fffffffffffff43c >> 0x18,0));
          LVar8 = BoxList::size((BoxList *)0x1379536);
          if (0 < LVar8) {
            pGVar10 = Geom(in_stack_fffffffffffff420,(int)((ulong)in_stack_fffffffffffff418 >> 0x20)
                          );
            Geometry::Domain(pGVar10);
            BoxList::intersect((BoxList *)in_stack_fffffffffffff480,
                               (Box *)CONCAT44(iVar14,in_stack_fffffffffffff478));
          }
          ClusterList::~ClusterList((ClusterList *)in_stack_fffffffffffff430);
        }
        BoxList::Bcast((BoxList *)in_stack_fffffffffffff420);
        Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                  ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                   in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
        BoxList::refine((BoxList *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460),
                        in_stack_fffffffffffff458);
        Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                  ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                   in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
        BoxArray::BoxArray(in_stack_fffffffffffff4c0,
                           (BoxList *)
                           CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8.itype),
                           (IntVect *)
                           CONCAT44(in_stack_fffffffffffff4b4.itype,in_stack_fffffffffffff4b0));
        Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                  ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                   in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
        BoxArray::operator=((BoxArray *)in_stack_fffffffffffff420,in_stack_fffffffffffff418);
        BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffff420);
        BoxList::~BoxList((BoxList *)0x1379625);
      }
    }
    PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~PODVector
              ((PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
               in_stack_fffffffffffff420);
    TagBoxArray::~TagBoxArray((TagBoxArray *)0x1379652);
    BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffff420);
  }
  while (local_984 = local_22c + indexType, (int)local_984 <= (int)*local_240) {
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
    bVar15 = BoxArray::empty((BoxArray *)0x13796e6);
    local_22c = local_984;
    if (bVar15) {
      bVar15 = useFixedCoarseGrids(in_RDI);
      if ((!bVar15) ||
         (in_stack_fffffffffffff43c = local_984, iVar14 = useFixedUpToLevel(in_RDI),
         iVar14 <= (int)in_stack_fffffffffffff43c)) {
        local_1a0 = "AmrMesh::MakeNewGrids: how did this happen?";
        Abort_host((char *)in_stack_fffffffffffff430);
      }
    }
    else if (((in_RDI->super_AmrInfo).refine_grid_layout & 1U) != 0) {
      in_stack_fffffffffffff430 =
           Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                     ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                      in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
      ParallelDescriptor::NProcs();
      ChopGrids(in_stack_fffffffffffff470,(int)((ulong)in_stack_fffffffffffff468 >> 0x20),
                (BoxArray *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460),
                (int)((ulong)in_stack_fffffffffffff458 >> 0x20));
      in_stack_fffffffffffff420 =
           (AmrMesh *)
           Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                     ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                      in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
      Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                 in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
      bVar15 = BoxArray::operator==
                         ((BoxArray *)in_stack_fffffffffffff440,
                          (BoxArray *)CONCAT44(in_stack_fffffffffffff43c,in_stack_fffffffffffff438))
      ;
      if (bVar15) {
        in_stack_fffffffffffff418 =
             Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                       ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                        in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
        Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                  ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                   in_stack_fffffffffffff420,(size_type)in_stack_fffffffffffff418);
        BoxArray::operator=((BoxArray *)in_stack_fffffffffffff420,in_stack_fffffffffffff418);
      }
    }
  }
  BoxList::~BoxList((BoxList *)0x137984f);
  BoxList::~BoxList((BoxList *)0x137985c);
  BoxList::~BoxList((BoxList *)0x1379869);
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~Vector
            ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)0x1379876);
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~Vector
            ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)0x1379883);
  Vector<amrex::Box,_std::allocator<amrex::Box>_>::~Vector
            ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x1379890);
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~Vector
            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)0x137989d);
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~Vector
            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)0x13798aa);
  return;
}

Assistant:

void
AmrMesh::MakeNewGrids (int lbase, Real time, int& new_finest, Vector<BoxArray>& new_grids)
{
    BL_PROFILE("AmrMesh::MakeNewGrids()");

    BL_ASSERT(lbase < max_level);

    // Add at most one new level
    int max_crse = std::min(finest_level, max_level-1);

    if (new_grids.size() < max_crse+2) new_grids.resize(max_crse+2);

    //
    // Construct problem domain at each level.
    //
    Vector<IntVect> bf_lev(max_level); // Blocking factor at each level.
    Vector<IntVect> rr_lev(max_level);
    Vector<Box>     pc_domain(max_level);  // Coarsened problem domain.

    for (int i = 0; i <= max_crse; i++)
    {
        for (int n=0; n<AMREX_SPACEDIM; n++) {
            bf_lev[i][n] = std::max(1,blocking_factor[i+1][n]/ref_ratio[i][n]);
        }
    }
    for (int i = lbase; i < max_crse; i++)
    {
        for (int n=0; n<AMREX_SPACEDIM; n++) {
            // Note that in AmrMesh we check that
            // ref ratio * coarse blocking factor >= fine blocking factor
            rr_lev[i][n] = (ref_ratio[i][n]*bf_lev[i][n])/bf_lev[i+1][n];
        }
    }
    for (int i = lbase; i <= max_crse; i++) {
        pc_domain[i] = amrex::coarsen(Geom(i).Domain(),bf_lev[i]);
    }
    //
    // Construct proper nesting domains.
    //
    Vector<BoxArray> p_n_ba(max_level); // Proper nesting domain.
    Vector<BoxArray> p_n_comp_ba(max_level); // Complement proper nesting domain.
    BoxList p_n, p_n_comp;

    BoxList bl = grids[lbase].simplified_list();
    bl.coarsen(bf_lev[lbase]);
    p_n_comp.parallelComplementIn(pc_domain[lbase],bl);
    bl.clear();
    p_n_comp.simplify();
    p_n_comp.accrete(n_proper);
    if (geom[lbase].isAnyPeriodic()) {
        ProjPeriodic(p_n_comp, pc_domain[lbase], geom[lbase].isPeriodic());
    }

    p_n_comp_ba[lbase].define(std::move(p_n_comp));
    p_n_comp = BoxList();

    p_n.parallelComplementIn(pc_domain[lbase],p_n_comp_ba[lbase]);
    p_n.simplify();

    p_n_ba[lbase].define(std::move(p_n));
    p_n = BoxList();

    for (int i = lbase+1; i <= max_crse; i++)
    {
        p_n_comp = p_n_comp_ba[i-1].boxList();

        // Need to simplify p_n_comp or the number of grids can too large for many levels.
        p_n_comp.simplify();

        p_n_comp.refine(rr_lev[i-1]);
        p_n_comp.accrete(n_proper);

        if (geom[i].isAnyPeriodic()) {
            ProjPeriodic(p_n_comp, pc_domain[i], geom[i].isPeriodic());
        }

        p_n_comp_ba[i].define(std::move(p_n_comp));
        p_n_comp = BoxList();

        p_n.parallelComplementIn(pc_domain[i],p_n_comp_ba[i]);
        p_n.simplify();

        p_n_ba[i].define(std::move(p_n));
        p_n = BoxList();
    }

    //
    // Now generate grids from finest level down.
    //
    new_finest = lbase;

    for (int levc = max_crse; levc >= lbase; levc--)
    {
        int levf = levc+1;
        //
        // Construct TagBoxArray with sufficient grow factor to contain
        // new levels projected down to this level.
        //
        IntVect ngt = n_error_buf[levc];
        BoxArray ba_proj;
        if (levf < new_finest)
        {
            ba_proj = new_grids[levf+1].simplified();
            ba_proj.coarsen(ref_ratio[levf]);
            ba_proj.growcoarsen(n_proper, ref_ratio[levc]);

            BoxArray levcBA = grids[levc].simplified();
            int ngrow = 0;
            while (!levcBA.contains(ba_proj))
            {
                levcBA.grow(1);
                ++ngrow;
            }
            ngt.max(IntVect(ngrow));
        }
        TagBoxArray tags(grids[levc],dmap[levc],ngt);

        //
        // Only use error estimation to tag cells for the creation of new grids
        //      if the grids at that level aren't already fixed.
        //

        if ( ! (useFixedCoarseGrids() && levc < useFixedUpToLevel()) ) {
            ErrorEst(levc, tags, time, 0);
        }

        //
        // Buffer error cells.
        //
        tags.buffer(n_error_buf[levc]);

        if (useFixedCoarseGrids())
        {
            if (levc>=useFixedUpToLevel())
            {
                tags.setVal(GetAreaNotToTag(levc), TagBox::CLEAR);
            }
            else
            {
                new_finest = std::max(new_finest,levf);
            }
        }

        //
        // Coarsen the taglist by blocking_factor/ref_ratio.
        //
        int bl_max = 0;
        for (int n=0; n<AMREX_SPACEDIM; n++) {
            bl_max = std::max(bl_max,bf_lev[levc][n]);
        }
        if (bl_max >= 1) {
            tags.coarsen(bf_lev[levc]);
        } else {
            amrex::Abort("blocking factor is too small relative to ref_ratio");
        }
        //
        // Remove or add tagged points which violate/satisfy additional
        // user-specified criteria.
        //
        ManualTagsPlacement(levc, tags, bf_lev);
        //
        // If new grids have been constructed above this level, project
        // those grids down and tag cells on intersections to ensure
        // proper nesting.
        //
        if (levf < new_finest) {
            ba_proj.coarsen(bf_lev[levc]);
            tags.setVal(ba_proj,TagBox::SET);
        }
        //
        // Map tagged points through periodic boundaries, if any.
        //
        tags.mapPeriodicRemoveDuplicates(Geometry(pc_domain[levc],
                                                  Geom(levc).ProbDomain(),
                                                  Geom(levc).CoordInt(),
                                                  Geom(levc).isPeriodic()));
        //
        // Remove cells outside proper nesting domain for this level.
        //
        tags.setVal(p_n_comp_ba[levc],TagBox::CLEAR);
        p_n_comp_ba[levc].clear();
        //
        // Create initial cluster containing all tagged points.
        //
        Gpu::PinnedVector<IntVect> tagvec;
        tags.collate(tagvec);
        tags.clear();

        if (tagvec.size() > 0)
        {
            //
            // Created new level, now generate efficient grids.
            //
            if ( !(useFixedCoarseGrids() && levc<useFixedUpToLevel()) ) {
                new_finest = std::max(new_finest,levf);
            }

            if (levf > useFixedUpToLevel()) {
                BoxList new_bx;
                if (ParallelDescriptor::IOProcessor()) {
                    BL_PROFILE("AmrMesh-cluster");
                    //
                    // Construct initial cluster.
                    //
                    ClusterList clist(&tagvec[0], tagvec.size());
                    if (use_new_chop) {
                        clist.new_chop(grid_eff);
                    } else {
                        clist.chop(grid_eff);
                    }
                    clist.intersect(p_n_ba[levc]);
                    //
                    // Efficient properly nested Clusters have been constructed
                    // now generate list of grids at level levf.
                    //
                    clist.boxList(new_bx);
                    new_bx.refine(bf_lev[levc]);
                    new_bx.simplify();

                    if (new_bx.size()>0) {
                        // Chop new grids outside domain
                        new_bx.intersect(Geom(levc).Domain());
                    }
                }
                new_bx.Bcast();  // Broadcast the new BoxList to other processes

                //
                // Refine up to levf.
                //
                new_bx.refine(ref_ratio[levc]);
                BL_ASSERT(new_bx.isDisjoint());

                new_grids[levf] = BoxArray(std::move(new_bx), max_grid_size[levf]);
            }
        }
    }

#if 0
    if (!useFixedCoarseGrids()) {
        // check proper nesting
        // This check does not consider periodic boundary and could fail if
        // the blocking factor is not the same on all levels.
        for (int lev = lbase+1; lev <= new_finest; ++lev) {
            BoxArray const& cba = (lev == lbase+1) ? grids[lev-1] : new_grids[lev-1];
            BoxArray const& fba = amrex::coarsen(new_grids[lev],ref_ratio[lev-1]);
            IntVect np = bf_lev[lev-1] * n_proper;
            Box const& cdomain = Geom(lev-1).Domain();
            for (int i = 0, N = fba.size(); i < N; ++i) {
                Box const& fb = amrex::grow(fba[i],np) & cdomain;
                if (!cba.contains(fb,true)) {
                    amrex::Abort("AmrMesh::MakeNewGrids: new grids not properly nested");
                }
            }
        }
    }
#endif

    for (int lev = lbase+1; lev <= new_finest; ++lev) {
        if (new_grids[lev].empty())
        {
            if (!(useFixedCoarseGrids() && lev<useFixedUpToLevel()) ) {
                amrex::Abort("AmrMesh::MakeNewGrids: how did this happen?");
            }
        }
        else if (refine_grid_layout)
        {
            ChopGrids(lev,new_grids[lev],ParallelDescriptor::NProcs());
            if (new_grids[lev] == grids[lev]) {
                new_grids[lev] = grids[lev]; // to avoid duplicates
            }
        }
    }
}